

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.h
# Opt level: O3

void __thiscall RelPathEnv::~RelPathEnv(RelPathEnv *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

RelPathEnv(const string& rel_path, const string& abs_path)
    : rel_path_(rel_path),
      abs_path_(abs_path) {}